

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Bias_x86_avx2::forward_inplace(Bias_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar7 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _bias;
  __m256 _outp;
  __m256 _p;
  __m256 _bias256;
  int i;
  float bias;
  float *ptr;
  int q;
  float *bias_ptr;
  int size;
  int channels;
  int d;
  int h;
  int w;
  float *in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd54;
  int local_214;
  Mat local_200;
  float *local_1b8;
  int local_1ac;
  float *local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  float local_16c;
  float *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  float *local_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_cc;
  float *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float *local_88;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_18c = *(int *)(in_RSI + 0x2c);
  local_190 = *(int *)(in_RSI + 0x30);
  local_194 = *(int *)(in_RSI + 0x34);
  local_198 = *(int *)(in_RSI + 0x38);
  local_19c = local_18c * local_190 * local_194;
  local_1a8 = ncnn::Mat::operator_cast_to_float_
                        ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
  for (local_1ac = 0; local_1ac < local_198; local_1ac = local_1ac + 1) {
    ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    in_stack_fffffffffffffd48 = ncnn::Mat::operator_cast_to_float_(&local_200);
    ncnn::Mat::~Mat((Mat *)0x199f91);
    local_16c = local_1a8[local_1ac];
    local_214 = 0;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_16c),ZEXT416((uint)local_16c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_16c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_16c),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_16c),ZEXT416((uint)local_16c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_16c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_16c),0x30);
    auVar7._16_16_ = auVar1;
    auVar7._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    local_1b8 = in_stack_fffffffffffffd48;
    for (; local_214 + 7 < local_19c; local_214 = local_214 + 8) {
      local_168 = local_1b8;
      uVar3 = *(undefined8 *)local_1b8;
      uVar4 = *(undefined8 *)(local_1b8 + 2);
      uVar5 = *(undefined8 *)(local_1b8 + 4);
      uVar6 = *(undefined8 *)(local_1b8 + 6);
      local_140._0_4_ = (float)uVar3;
      local_140._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_138._0_4_ = (float)uVar4;
      uStack_138._4_4_ = (float)((ulong)uVar4 >> 0x20);
      uStack_130._0_4_ = (float)uVar5;
      uStack_130._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_128._0_4_ = (float)uVar6;
      uStack_128._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_160._0_4_ = auVar2._0_4_;
      local_160._4_4_ = auVar2._4_4_;
      uStack_158._0_4_ = auVar2._8_4_;
      uStack_158._4_4_ = auVar2._12_4_;
      uStack_150._0_4_ = auVar1._0_4_;
      uStack_150._4_4_ = auVar1._4_4_;
      uStack_148._0_4_ = auVar1._8_4_;
      uStack_148._4_4_ = auVar1._12_4_;
      local_e8 = local_1b8;
      local_120 = CONCAT44(local_140._4_4_ + local_160._4_4_,(float)local_140 + (float)local_160);
      uStack_118 = CONCAT44(uStack_138._4_4_ + uStack_158._4_4_,
                            (float)uStack_138 + (float)uStack_158);
      uStack_110 = CONCAT44(uStack_130._4_4_ + uStack_150._4_4_,
                            (float)uStack_130 + (float)uStack_150);
      uStack_108 = CONCAT44(uStack_128._4_4_ + uStack_148._4_4_,
                            (float)uStack_128 + (float)uStack_148);
      *(undefined8 *)local_1b8 = local_120;
      *(undefined8 *)(local_1b8 + 2) = uStack_118;
      *(undefined8 *)(local_1b8 + 4) = uStack_110;
      *(undefined8 *)(local_1b8 + 6) = uStack_108;
      local_1b8 = local_1b8 + 8;
      local_160 = local_80._0_8_;
      uStack_158 = local_80._8_8_;
      uStack_150 = local_80._16_8_;
      uStack_148 = local_80._24_8_;
      local_140 = uVar3;
      uStack_138 = uVar4;
      uStack_130 = uVar5;
      uStack_128 = uVar6;
    }
    for (; local_214 + 3 < local_19c; local_214 = local_214 + 4) {
      local_c8 = local_1b8;
      uVar3 = *(undefined8 *)local_1b8;
      uVar4 = *(undefined8 *)(local_1b8 + 2);
      local_b0._0_4_ = (float)uVar3;
      local_b0._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_a8._0_4_ = (float)uVar4;
      uStack_a8._4_4_ = (float)((ulong)uVar4 >> 0x20);
      in_stack_fffffffffffffd50 = (float)local_b0 + local_16c;
      in_stack_fffffffffffffd54 = local_b0._4_4_ + local_16c;
      local_88 = local_1b8;
      local_a0 = CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
      uStack_98 = CONCAT44(uStack_a8._4_4_ + local_16c,(float)uStack_a8 + local_16c);
      *(undefined8 *)local_1b8 = local_a0;
      *(undefined8 *)(local_1b8 + 2) = uStack_98;
      local_1b8 = local_1b8 + 4;
      local_c0 = CONCAT44(local_16c,local_16c);
      uStack_b8 = CONCAT44(local_16c,local_16c);
      local_b0 = uVar3;
      uStack_a8 = uVar4;
    }
    for (; local_214 < local_19c; local_214 = local_214 + 1) {
      *local_1b8 = *local_1b8 + local_16c;
      local_1b8 = local_1b8 + 1;
    }
    local_e0 = local_16c;
    fStack_dc = local_16c;
    fStack_d8 = local_16c;
    fStack_d4 = local_16c;
    local_cc = local_16c;
    local_80 = auVar7;
    local_50 = local_16c;
    local_4c = local_16c;
    local_48 = local_16c;
    local_44 = local_16c;
    local_40 = local_16c;
    local_3c = local_16c;
    local_38 = local_16c;
    local_34 = local_16c;
  }
  return 0;
}

Assistant:

int Bias_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}